

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test::TestBody
          (QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test
           *this)

{
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  *this_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_00;
  bool bVar1;
  TransactionType TVar2;
  TransactionMetaType TVar3;
  char *pcVar4;
  char *in_R9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_428;
  string local_3f0;
  AssertHelper local_3d0;
  Message local_3c8;
  api_filter_type local_3c0;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_368;
  iterator local_340;
  size_type local_338;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_310;
  iterator local_2d8;
  size_type local_2d0;
  undefined1 local_2c8 [8];
  api_filter_type filter;
  AssertHelper local_278;
  Message local_270;
  string local_268;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_210;
  Message local_208;
  string local_200;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  string local_178;
  AssertHelper local_158;
  Message local_150 [3];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  Query query_select_all_with_criteria;
  QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test
  *this_local;
  
  database::Query::Query
            ((Query *)&gtest_ar_.message_,
             "select * from company.employee where employee_status <> parttime");
  TVar2 = database::Query::transactionType((Query *)&gtest_ar_.message_);
  local_131 = TVar2 == select_all;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_130,
               (AssertionResult *)
               "query_select_all_with_criteria.transactionType() == database::select_all","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(local_150);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    TVar3 = database::Query::transactionMetaType((Query *)&gtest_ar_.message_);
    local_191 = TVar3 == dml;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_190,&local_191,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_190,
                 (AssertionResult *)
                 "query_select_all_with_criteria.transactionMetaType() == database::dml","false",
                 "true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0x6e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1a0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      database::Query::databaseName_abi_cxx11_(&local_200,(Query *)&gtest_ar_.message_);
      local_1d9 = std::operator==(&local_200,"company");
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_200);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_1d8,
                   (AssertionResult *)"query_select_all_with_criteria.databaseName() == \"company\""
                   ,"false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0x6f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_210,&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_208);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        database::Query::containerName_abi_cxx11_(&local_268,(Query *)&gtest_ar_.message_);
        local_241 = std::operator==(&local_268,"employee");
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_240,&local_241,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_268);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
        if (!bVar1) {
          testing::Message::Message(&local_270);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&filter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (internal *)local_240,
                     (AssertionResult *)
                     "query_select_all_with_criteria.containerName() == \"employee\"","false","true"
                     ,in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_278,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0x70,pcVar4);
          testing::internal::AssertHelper::operator=(&local_278,&local_270);
          testing::internal::AssertHelper::~AssertHelper(&local_278);
          std::__cxx11::string::~string
                    ((string *)&filter._M_t._M_impl.super__Rb_tree_header._M_node_count);
          testing::Message::~Message(&local_270);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__4.message_.ptr_._2_1_ = 1;
          local_318 = &local_310;
          gtest_ar__4.message_.ptr_._4_4_ = 1;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
          ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                    (&local_368,(char (*) [9])0x17c68c,
                     (ComparisonType *)((long)&gtest_ar__4.message_.ptr_ + 4));
          local_340 = &local_368;
          local_338 = 1;
          this_00 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                     *)((long)&gtest_ar__4.message_.ptr_ + 3);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::allocator(this_00);
          __l._M_len = local_338;
          __l._M_array = local_340;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector(&local_330,__l,this_00);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[16],_true>(&local_310,(char (*) [16])"employee_status",&local_330);
          gtest_ar__4.message_.ptr_._2_1_ = 0;
          local_2d8 = &local_310;
          local_2d0 = 1;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                       *)&gtest_ar__4.message_);
          __l_00._M_len = local_2d0;
          __l_00._M_array = local_2d8;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                 *)local_2c8,__l_00,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&gtest_ar__4.message_.ptr_ + 1),(allocator_type *)&gtest_ar__4.message_);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                        *)&gtest_ar__4.message_);
          local_428 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                       *)&local_2d8;
          do {
            local_428 = local_428 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
            ::~pair(local_428);
          } while (local_428 != &local_310);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector(&local_330);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                        *)((long)&gtest_ar__4.message_.ptr_ + 3));
          local_440 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                       *)&local_340;
          do {
            local_440 = local_440 + -1;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
            ::~pair(local_440);
          } while (local_440 != &local_368);
          database::Query::filter_abi_cxx11_(&local_3c0,(Query *)&gtest_ar_.message_);
          local_389 = std::operator==(&local_3c0,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                       *)local_2c8);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_388,&local_389,(type *)0x0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map(&local_3c0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar1) {
            testing::Message::Message(&local_3c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_3f0,(internal *)local_388,
                       (AssertionResult *)"query_select_all_with_criteria.filter() == filter",
                       "false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0x74,pcVar4);
            testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
            testing::internal::AssertHelper::~AssertHelper(&local_3d0);
            std::__cxx11::string::~string((string *)&local_3f0);
            testing::Message::~Message(&local_3c8);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            gtest_ar__1.message_.ptr_._4_4_ = 0;
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                  *)local_2c8);
        }
      }
    }
  }
  database::Query::~Query((Query *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(QueryTests_SelectAll_WithCriteria,canDetermineSpecificationForSelectAllWithCriteria)
{
  database::Query query_select_all_with_criteria = "select * from company.employee where employee_status <> parttime";
  ASSERT_TRUE(query_select_all_with_criteria.transactionType() == database::select_all);
  ASSERT_TRUE(query_select_all_with_criteria.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_all_with_criteria.databaseName() == "company");
  ASSERT_TRUE(query_select_all_with_criteria.containerName() == "employee");
  database::api_filter_type filter = {
    {"employee_status",{{"parttime",database::not_equal_to}}}
  };
  ASSERT_TRUE(query_select_all_with_criteria.filter() == filter);
}